

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O3

bool __thiscall libchars::history::search_prev(history *this)

{
  history hVar1;
  long lVar2;
  string *psVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  hVar1 = this[8];
  if (hVar1 == (history)0x1) {
    lVar5 = *(long *)(this + 0x30);
    lVar2 = *(long *)(this + 0x48);
    if (lVar2 != lVar5) {
      lVar6 = lVar2;
      do {
        lVar6 = *(long *)(lVar6 + 8);
        *(long *)(this + 0x48) = lVar6;
        psVar3 = *(string **)(this + 0x58);
        if (psVar3 == (string *)0x0) {
LAB_0011170e:
          this[0x50] = (history)0x0;
          return true;
        }
        if (psVar3 <= *(string **)(lVar6 + 0x18)) {
          iVar4 = std::__cxx11::string::compare((ulong)(this + 0x10),0,psVar3,lVar6 + 0x10,0);
          if (iVar4 == 0) goto LAB_0011170e;
          lVar5 = *(long *)(this + 0x30);
          lVar6 = *(long *)(this + 0x48);
        }
      } while (lVar6 != lVar5);
    }
    *(long *)(this + 0x48) = lVar2;
  }
  return (bool)hVar1;
}

Assistant:

bool history::search_prev()
    {
        if (!busy)
            return false;

        history_lines_t::const_iterator li_current(li);

        while (li != lines.begin()) {
            --li;
            const std::string &lis = *li;
            if (s_idx == 0 || (lis.length() >= s_idx && line_tmp.compare(0,s_idx,lis,0,s_idx) == 0)) {
                overflow = false;
                return true;
            }
        }

        // stay on previous value
        li = li_current;
        return true;
    }